

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBCellFlag.cpp
# Opt level: O3

ostream * amrex::operator<<(ostream *os,EBCellFlag *flag)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  int j;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  fmtflags __old;
  int k;
  
  uVar1 = *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
  *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) = uVar1 & 0xffffffb5 | 8;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::__ostream_insert<char,std::char_traits<char>>
            (os,&DAT_0067cdd4 + *(int *)(&DAT_0067cdd4 + (ulong)(flag->flag & 3) * 4),1);
  iVar2 = -1;
  iVar5 = 5;
  do {
    iVar4 = -1;
    iVar6 = iVar5;
    do {
      iVar7 = 0;
      do {
        std::ostream::operator<<(os,(uint)((flag->flag >> (iVar7 + iVar6 & 0x1fU) & 1) != 0));
        iVar7 = iVar7 + 1;
      } while (iVar7 != 3);
      iVar4 = iVar4 + 1;
      iVar6 = iVar6 + 3;
    } while (iVar4 != 2);
    iVar2 = iVar2 + 1;
    iVar5 = iVar5 + 9;
  } while (iVar2 != 2);
  *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) = uVar1;
  return os;
}

Assistant:

std::ostream&
operator<< (std::ostream& os, const EBCellFlag& flag)
{
    std::ios_base::fmtflags old_fmt = os.flags();
    os << std::hex << flag.getValue() << ":" << std::dec;

    if (flag.isRegular()) {
        os << "R";
    } else if (flag.isSingleValued()) {
        os << "S";
    } else if (flag.isCovered()) {
        os << "C";
    } else {
        os << "M";
    }

#if (AMREX_SPACEDIM == 3)
    for (int k = -1; k <= 1; ++k) {
#endif
        for (int j = -1; j <= 1; ++j) {
            for (int i = -1; i <= 1; ++i) {
                os << static_cast<int>(flag.isConnected(IntVect{AMREX_D_DECL(i,j,k)}));
            }
        }
#if (AMREX_SPACEDIM == 3)
    }
#endif

    os.flags(old_fmt);

    return os;
}